

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O1

void __thiscall num_parse_test_parse_float_Test::TestBody(num_parse_test_parse_float_Test *this)

{
  bool bVar1;
  char *pcVar2;
  array<unsigned_char,_4UL> bytes_arr;
  float resf32;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  array<unsigned_char,_4UL> local_20 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  float local_c;
  
  local_20[0]._M_elems[0] = '\0';
  local_20[0]._M_elems[1] = '\0';
  local_20[0]._M_elems[2] = 0xc0;
  local_20[0]._M_elems[3] = '?';
  local_c = mvm::num::parse_floating<float,4ul>(local_20);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ff8000000000000;
  testing::internal::CmpHelperEQ<float,double>
            ((internal *)local_20,"resf32","1.5",&local_c,(double *)&local_30);
  if ((internal)local_20[0]._M_elems[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20[0]._M_elems[0] = '\0';
  local_20[0]._M_elems[1] = '\0';
  local_20[0]._M_elems[2] = 0x90;
  local_20[0]._M_elems[3] = '?';
  local_c = mvm::num::parse_floating<float,4ul>(local_20);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ff2000000000000;
  testing::internal::CmpHelperEQ<float,double>
            ((internal *)local_20,"resf32","1.125",&local_c,(double *)&local_30);
  if ((internal)local_20[0]._M_elems[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20[0]._M_elems[0] = '\0';
  local_20[0]._M_elems[1] = '\0';
  local_20[0]._M_elems[2] = '\x10';
  local_20[0]._M_elems[3] = 0xc0;
  local_c = mvm::num::parse_floating<float,4ul>(local_20);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_c002000000000000;
  testing::internal::CmpHelperEQ<float,double>
            ((internal *)local_20,"resf32","-2.25",&local_c,(double *)&local_30);
  if ((internal)local_20[0]._M_elems[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(num_parse_test, parse_float) {
  uint32_t f_as_ui = 0x3fc00000; // 1.5
  auto resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, 1.5);

  f_as_ui = 0x3f900000; // 1.125
  resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, 1.125);

  f_as_ui = 0xc0100000; // -2.25
  resf32 = parse<float, sizeof(float), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf32, -2.25);
}